

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O2

int ops_resize(regex_t *reg,int n)

{
  Operation *pOVar1;
  OpCode *pOVar2;
  int iVar3;
  
  iVar3 = 0;
  if (reg->ops_alloc != n) {
    if (n < 1) {
      iVar3 = -0xb;
    }
    else {
      pOVar1 = (Operation *)realloc(reg->ops,(ulong)(uint)n * 0x18);
      iVar3 = -5;
      if (pOVar1 != (Operation *)0x0) {
        reg->ops = pOVar1;
        pOVar2 = (OpCode *)realloc(reg->ocs,(ulong)(uint)n << 2);
        if (pOVar2 != (OpCode *)0x0) {
          reg->ocs = pOVar2;
          reg->ops_alloc = n;
          iVar3 = 0;
          if (reg->ops_used == 0) {
            pOVar1 = (Operation *)0x0;
          }
          else {
            pOVar1 = reg->ops + (reg->ops_used - 1);
          }
          reg->ops_curr = pOVar1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int
ops_resize(regex_t* reg, int n)
{
#ifdef USE_DIRECT_THREADED_CODE
  enum OpCode* cp;
#endif
  Operation* p;
  size_t size;

  if (n == reg->ops_alloc) return ONIG_NORMAL;
  if (n <= 0) return ONIGERR_PARSER_BUG;

  size = sizeof(Operation) * n;
  p = (Operation* )xrealloc(reg->ops, size);
  CHECK_NULL_RETURN_MEMERR(p);
  reg->ops = p;

#ifdef USE_DIRECT_THREADED_CODE
  size = sizeof(enum OpCode) * n;
  cp = (enum OpCode* )xrealloc(reg->ocs, size);
  CHECK_NULL_RETURN_MEMERR(cp);
  reg->ocs = cp;
#endif

  reg->ops_alloc = n;
  if (reg->ops_used == 0)
    reg->ops_curr = 0;
  else
    reg->ops_curr = reg->ops + (reg->ops_used - 1);

  return ONIG_NORMAL;
}